

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmlookup.cpp
# Opt level: O0

int __thiscall
CVmObjLookupTable::get_prop
          (CVmObjLookupTable *this,vm_prop_id_t prop,vm_val_t *retval,vm_obj_id_t self,
          vm_obj_id_t *source_obj,uint *argc)

{
  CVmMetaTable *pCVar1;
  uint self_00;
  int iVar2;
  vm_obj_id_t vVar3;
  undefined4 in_ECX;
  undefined8 in_RDX;
  CVmMetaTable *in_RDI;
  vm_obj_id_t *in_R8;
  vm_val_t *in_R9;
  uint func_idx;
  CVmMetaclass *local_68;
  CVmMetaclass *this_00;
  vm_obj_id_t *source_obj_00;
  undefined4 in_stack_ffffffffffffffd8;
  int local_4;
  
  pCVar1 = G_meta_table_X;
  CVmMetaclass::get_reg_idx(metaclass_reg_);
  self_00 = CVmMetaTable::prop_to_vector_idx
                      (in_RDI,(uint)((ulong)pCVar1 >> 0x20),(vm_prop_id_t)((ulong)pCVar1 >> 0x10));
  this_00 = (CVmMetaclass *)func_table_[(ulong)self_00 * 2];
  source_obj_00 = (vm_obj_id_t *)((long)&in_RDI->table_ + func_table_[(ulong)self_00 * 2 + 1]);
  local_68 = this_00;
  if (((ulong)this_00 & 1) != 0) {
    local_68 = *(CVmMetaclass **)((long)this_00 + *(long *)source_obj_00 + -1);
  }
  iVar2 = (*(code *)local_68)(source_obj_00,in_ECX,in_RDX,in_R9);
  if (iVar2 == 0) {
    local_4 = CVmObjCollection::get_prop
                        ((CVmObjCollection *)CONCAT44(in_ECX,in_stack_ffffffffffffffd8),
                         (vm_prop_id_t)((ulong)in_R8 >> 0x30),in_R9,self_00,source_obj_00,
                         (uint *)this_00);
  }
  else {
    vVar3 = CVmMetaclass::get_class_obj(this_00);
    *in_R8 = vVar3;
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int CVmObjLookupTable::get_prop(VMG_ vm_prop_id_t prop, vm_val_t *retval,
                                vm_obj_id_t self, vm_obj_id_t *source_obj,
                                uint *argc)
{
    uint func_idx;

    /* translate the property into a function vector index */
    func_idx = G_meta_table
               ->prop_to_vector_idx(metaclass_reg_->get_reg_idx(), prop);

    /* call the appropriate function */
    if ((this->*func_table_[func_idx])(vmg_ self, retval, argc))
    {
        *source_obj = metaclass_reg_->get_class_obj(vmg0_);
        return TRUE;
    }

    /* inherit default handling from our base class */
    return CVmObjCollection::
        get_prop(vmg_ prop, retval, self, source_obj, argc);
}